

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int QMetaTypeIdQObject<QNetworkProxyQuery::QueryType,_16>::qt_metatype_id(void)

{
  long lVar1;
  int iVar2;
  char *__s;
  char *__s_00;
  long in_FS_OFFSET;
  int newId;
  char *cName;
  char *eName;
  int id;
  QByteArray typeName;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QBasicAtomicInteger<int>::loadAcquire((QBasicAtomicInteger<int> *)0x24e1f2);
  if (iVar2 == 0) {
    __s = ::qt_getEnumName(TcpSocket);
    ::qt_getEnumMetaObject(TcpSocket);
    __s_00 = (char *)QMetaObject::className();
    QByteArray::QByteArray((QByteArray *)0x24e258);
    strlen(__s_00);
    strlen(__s);
    QByteArray::reserve((QByteArray *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT44(in_stack_ffffffffffffffdc,iVar2));
    QByteArray::append((QByteArray *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QByteArray::append((QByteArray *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QByteArray::append((QByteArray *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar2 = qRegisterNormalizedMetaType<QNetworkProxyQuery::QueryType>((QByteArray *)0x24e2bc);
    QBasicAtomicInteger<int>::storeRelease
              ((QBasicAtomicInteger<int> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    QByteArray::~QByteArray((QByteArray *)0x24e2e2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *eName = qt_getEnumName(T());
        const char *cName = qt_getEnumMetaObject(T())->className();
        QByteArray typeName;
        typeName.reserve(strlen(cName) + 2 + strlen(eName));
        typeName.append(cName).append("::").append(eName);
        const int newId = qRegisterNormalizedMetaType<T>(typeName);
        metatype_id.storeRelease(newId);
        return newId;
    }